

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

void __thiscall QHexView::mouseMoveEvent(QHexView *this,QMouseEvent *e)

{
  bool bVar1;
  QHexCursor *pQVar2;
  QCursor *pQVar3;
  QPoint pt;
  fd_set *in_RCX;
  sockaddr *__addr;
  int __fd;
  fd_set *in_R8;
  timeval *in_R9;
  undefined1 local_68 [8];
  QHexPosition pos;
  QCursor local_50 [8];
  QCursor local_48 [24];
  QCursor local_30 [12];
  QPoint local_24;
  QHexArea local_1c;
  QMouseEvent *pQStack_18;
  QHexArea area;
  QMouseEvent *e_local;
  QHexView *this_local;
  
  __fd = (int)e;
  pQStack_18 = e;
  e_local = (QMouseEvent *)this;
  QAbstractScrollArea::mouseMoveEvent((QMouseEvent *)this);
  pQVar2 = hexCursor(this);
  if (pQVar2 != (QHexCursor *)0x0) {
    QEvent::accept((QEvent *)pQStack_18,__fd,__addr,(socklen_t *)in_RCX);
    local_24 = QMouseEvent::pos(pQStack_18);
    local_1c = areaFromPoint(this,local_24);
    if (local_1c == Header) {
      pQVar3 = (QCursor *)QAbstractScrollArea::viewport();
      QCursor::QCursor(local_30,ArrowCursor);
      QWidget::setCursor(pQVar3);
      QCursor::~QCursor(local_30);
    }
    else {
      if (local_1c == Address) {
        pQVar3 = (QCursor *)QAbstractScrollArea::viewport();
        QCursor::QCursor(local_48,ArrowCursor);
        QWidget::setCursor(pQVar3);
        QCursor::~QCursor(local_48);
      }
      else {
        pQVar3 = (QCursor *)QAbstractScrollArea::viewport();
        QCursor::QCursor(local_50,IBeamCursor);
        QWidget::setCursor(pQVar3);
        QCursor::~QCursor(local_50);
      }
      pos.column._4_4_ = QSinglePointEvent::buttons((QSinglePointEvent *)pQStack_18);
      bVar1 = ::operator==((QFlags<Qt::MouseButton>)pos.column._4_4_,LeftButton);
      if (bVar1) {
        pt = QMouseEvent::pos(pQStack_18);
        _local_68 = positionFromPoint(this,pt);
        bVar1 = QHexPosition::isValid((QHexPosition *)local_68);
        if (bVar1) {
          if ((local_1c == Ascii) || (local_1c == Hex)) {
            in_RCX = (fd_set *)(ulong)local_1c;
            this->m_currentarea = local_1c;
          }
          pQVar2 = hexCursor(this);
          QHexCursor::select(pQVar2,local_68._0_4_,(fd_set *)pos.line,in_RCX,in_R8,in_R9);
        }
      }
    }
  }
  return;
}

Assistant:

void QHexView::mouseMoveEvent(QMouseEvent* e) {
    QAbstractScrollArea::mouseMoveEvent(e);
    if(!this->hexCursor())
        return;

    e->accept();
    auto area = this->areaFromPoint(e->pos());

    switch(area) {
        case QHexArea::Header:
            this->viewport()->setCursor(Qt::ArrowCursor);
            return;
        case QHexArea::Address:
            this->viewport()->setCursor(Qt::ArrowCursor);
            break;
        default: this->viewport()->setCursor(Qt::IBeamCursor); break;
    }

    if(e->buttons() == Qt::LeftButton) {
        auto pos = this->positionFromPoint(e->pos());
        if(!pos.isValid())
            return;
        if(area == QHexArea::Ascii || area == QHexArea::Hex)
            m_currentarea = area;
        this->hexCursor()->select(pos);
    }
}